

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_20::ChElementHexaCorot_20(ChElementHexaCorot_20 *this)

{
  ChGaussIntegrationRule *this_00;
  ActualDstType actualDst;
  undefined1 auVar1 [64];
  assign_op<double,_double> local_41;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_40;
  
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  *(undefined1 (*) [16])
   ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       ZEXT416(0) << 0x40;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  *(undefined1 (*) [16])
   ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       ZEXT416(0) << 0x40;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = (_func_int **)0xb35080;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb351a0;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb35260;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb352f0;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                 )auVar1._0_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumElastic>)auVar1._24_16_;
  this->StiffnessMatrix = (ChMatrixDynamic<>)auVar1._40_24_;
  this->StiffnessMatrix = (ChMatrixDynamic<>)auVar1._0_24_;
  this->ir = (ChGaussIntegrationRule *)auVar1._24_8_;
  this->GpVector =
       (vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>)
       auVar1._32_24_;
  this->Volume = (double)auVar1._56_8_;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->nodes,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->StiffnessMatrix,0xe10,0x3c,0x3c);
  local_40.m_rows.m_value =
       (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_rows;
  local_40.m_cols.m_value =
       (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_cols;
  local_40.m_functor.m_other = 0.0;
  if (-1 < (local_40.m_cols.m_value | local_40.m_rows.m_value)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->StiffnessMatrix,&local_40,&local_41);
    this_00 = (ChGaussIntegrationRule *)::operator_new(8);
    ChGaussIntegrationRule::ChGaussIntegrationRule(this_00);
    this->ir = this_00;
    (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[8])(this);
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementHexaCorot_20::ChElementHexaCorot_20() : ir(nullptr), Volume(0) {
    nodes.resize(20);
    this->StiffnessMatrix.setZero(60, 60);
    this->ir = new ChGaussIntegrationRule;
    this->SetDefaultIntegrationRule();
}